

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_typed_array_get_toStringTag(JSContext *ctx,JSValue this_val)

{
  int in_EDX;
  JSContext *in_RSI;
  JSObject *p;
  JSAtom in_stack_ffffffffffffffcc;
  JSValueUnion local_10;
  int64_t local_8;
  
  if (in_EDX == -1) {
    if (((in_RSI->header).dummy2 < 0x15) || (0x1d < (in_RSI->header).dummy2)) {
      local_10.ptr = (void *)(local_10 << 0x20);
      local_8 = 3;
    }
    else {
      _local_10 = JS_AtomToString(in_RSI,in_stack_ffffffffffffffcc);
    }
  }
  else {
    local_10.ptr = (void *)(local_10 << 0x20);
    local_8 = 3;
  }
  return _local_10;
}

Assistant:

static JSValue js_typed_array_get_toStringTag(JSContext *ctx,
                                              JSValueConst this_val)
{
    JSObject *p;
    if (JS_VALUE_GET_TAG(this_val) != JS_TAG_OBJECT)
        return JS_UNDEFINED;
    p = JS_VALUE_GET_OBJ(this_val);
    if (!(p->class_id >= JS_CLASS_UINT8C_ARRAY &&
          p->class_id <= JS_CLASS_FLOAT64_ARRAY))
        return JS_UNDEFINED;
    return JS_AtomToString(ctx, ctx->rt->class_array[p->class_id].class_name);
}